

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

char * CodepointToUtf8(int codepoint,int *byteLength)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = (byte)codepoint;
  if (codepoint < 0x80) {
    iVar1 = 1;
    CodepointToUtf8::utf8[0] = bVar2;
  }
  else if ((uint)codepoint < 0x800) {
    CodepointToUtf8::utf8[0] = (byte)((uint)codepoint >> 6) | 0xc0;
    CodepointToUtf8::utf8[1] = bVar2 & 0x3f | 0x80;
    iVar1 = 2;
  }
  else if ((uint)codepoint < 0x10000) {
    CodepointToUtf8::utf8[0] = (byte)((uint)codepoint >> 0xc) | 0xe0;
    CodepointToUtf8::utf8[1] = (byte)((uint)codepoint >> 6) & 0x3f | 0x80;
    CodepointToUtf8::utf8[2] = bVar2 & 0x3f | 0x80;
    iVar1 = 3;
  }
  else {
    iVar1 = 0;
    if ((uint)codepoint < 0x110000) {
      CodepointToUtf8::utf8[0] = (byte)((uint)codepoint >> 0x12) | 0xf0;
      CodepointToUtf8::utf8[1] = (byte)((uint)codepoint >> 0xc) & 0x3f | 0x80;
      CodepointToUtf8::utf8[2] = (byte)((uint)codepoint >> 6) & 0x3f | 0x80;
      CodepointToUtf8::utf8[3] = bVar2 & 0x3f | 0x80;
      iVar1 = 4;
    }
  }
  *byteLength = iVar1;
  return CodepointToUtf8::utf8;
}

Assistant:

RLAPI const char *CodepointToUtf8(int codepoint, int *byteLength)
{
    static char utf8[6] = { 0 };
    int length = 0;

    if (codepoint <= 0x7f)
    {
        utf8[0] = (char)codepoint;
        length = 1;
    }
    else if (codepoint <= 0x7ff)
    {
        utf8[0] = (char)(((codepoint >> 6) & 0x1f) | 0xc0);
        utf8[1] = (char)((codepoint & 0x3f) | 0x80);
        length = 2;
    }
    else if (codepoint <= 0xffff)
    {
        utf8[0] = (char)(((codepoint >> 12) & 0x0f) | 0xe0);
        utf8[1] = (char)(((codepoint >>  6) & 0x3f) | 0x80);
        utf8[2] = (char)((codepoint & 0x3f) | 0x80);
        length = 3;
    }
    else if (codepoint <= 0x10ffff)
    {
        utf8[0] = (char)(((codepoint >> 18) & 0x07) | 0xf0);
        utf8[1] = (char)(((codepoint >> 12) & 0x3f) | 0x80);
        utf8[2] = (char)(((codepoint >>  6) & 0x3f) | 0x80);
        utf8[3] = (char)((codepoint & 0x3f) | 0x80);
        length = 4;
    }

    *byteLength = length;

    return utf8;
}